

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mercuryparser.cpp
# Opt level: O0

void MercuryJson::print_json(JsonValue *value,int indent)

{
  ostream *poVar1;
  undefined4 in_ESI;
  undefined4 *in_RDI;
  JsonArray *elem_1;
  JsonObject *elem;
  int cnt;
  long local_20;
  undefined8 in_stack_ffffffffffffffe8;
  undefined8 *puVar2;
  int iVar3;
  
  switch(*in_RDI) {
  case 0:
    std::operator<<((ostream *)&std::cout,"null");
    break;
  case 1:
    if ((*(byte *)(in_RDI + 2) & 1) == 0) {
      std::operator<<((ostream *)&std::cout,"false");
    }
    else {
      std::operator<<((ostream *)&std::cout,"true");
    }
    break;
  case 2:
    poVar1 = std::operator<<((ostream *)&std::cout,"\"");
    poVar1 = std::operator<<(poVar1,*(char **)(in_RDI + 2));
    std::operator<<(poVar1,"\"");
    break;
  case 3:
    poVar1 = std::operator<<((ostream *)&std::cout,"{");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    iVar3 = 0;
    for (puVar2 = *(undefined8 **)(in_RDI + 2); puVar2 != (undefined8 *)0x0;
        puVar2 = (undefined8 *)puVar2[2]) {
      print_indent(value._4_4_);
      poVar1 = std::operator<<((ostream *)&std::cout,"\"");
      poVar1 = std::operator<<(poVar1,(char *)*puVar2);
      std::operator<<(poVar1,"\": ");
      print_json((JsonValue *)CONCAT44(in_ESI,iVar3),(int)((ulong)puVar2 >> 0x20));
      if (puVar2[2] != 0) {
        std::operator<<((ostream *)&std::cout,",");
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      iVar3 = iVar3 + 1;
    }
    print_indent(value._4_4_);
    std::operator<<((ostream *)&std::cout,"}");
    break;
  case 4:
    poVar1 = std::operator<<((ostream *)&std::cout,"[");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    iVar3 = 0;
    for (local_20 = *(long *)(in_RDI + 2); local_20 != 0; local_20 = *(long *)(local_20 + 8)) {
      print_indent(value._4_4_);
      print_json((JsonValue *)CONCAT44(in_ESI,iVar3),(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20)
                );
      if (*(long *)(local_20 + 8) != 0) {
        std::operator<<((ostream *)&std::cout,",");
      }
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      iVar3 = iVar3 + 1;
    }
    print_indent(value._4_4_);
    std::operator<<((ostream *)&std::cout,"]");
    break;
  case 5:
    std::ostream::operator<<((ostream *)&std::cout,*(longlong *)(in_RDI + 2));
    break;
  case 6:
    std::ostream::operator<<((ostream *)&std::cout,*(double *)(in_RDI + 2));
  }
  return;
}

Assistant:

void print_json(JsonValue *value, int indent) {
        int cnt;
        switch (value->type) {
            case JsonValue::TYPE_NULL:
                std::cout << "null";
                break;
            case JsonValue::TYPE_BOOL:
                if (value->boolean) std::cout << "true";
                else std::cout << "false";
                break;
            case JsonValue::TYPE_STR:
                std::cout << "\"" << value->str << "\"";
                break;
            case JsonValue::TYPE_OBJ:
                std::cout << "{" << std::endl;
                cnt = 0;
                for (auto *elem = value->object; elem; elem = elem->next) {
                    print_indent(indent + 2);
                    std::cout << "\"" << elem->key << "\": ";
                    print_json(elem->value, indent + 2);
                    if (elem->next != nullptr)
                        std::cout << ",";
                    std::cout << std::endl;
                    ++cnt;
                }
                print_indent(indent);
                std::cout << "}";
                break;
            case JsonValue::TYPE_ARR:
                std::cout << "[" << std::endl;
                cnt = 0;
                for (auto *elem = value->array; elem; elem = elem->next) {
                    print_indent(indent + 2);
                    print_json(elem->value, indent + 2);
                    if (elem->next != nullptr)
                        std::cout << ",";
                    std::cout << std::endl;
                    ++cnt;
                }
                print_indent(indent);
                std::cout << "]";
                break;
            case JsonValue::TYPE_INT:
                std::cout << value->integer;
                break;
            case JsonValue::TYPE_DEC:
                std::cout << value->decimal;
                break;
        }
    }